

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropResizeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  string *psVar4;
  pointer pcVar5;
  uint __val;
  uint uVar6;
  bool bVar7;
  LogMessage *pLVar8;
  iterator iVar9;
  Type *pTVar10;
  mapped_type_conflict1 *pmVar11;
  LayerUnion LVar12;
  long *plVar13;
  undefined8 *puVar14;
  uint uVar15;
  ulong *puVar16;
  ulong uVar17;
  undefined8 uVar18;
  _Alloc_hider _Var19;
  uint __len;
  _Rb_tree_header *p_Var20;
  Result r;
  string err;
  string err_1;
  string __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  undefined1 local_100 [40];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result((Result *)&local_138);
  validateInputCount((Result *)local_110,layer,2,2);
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110;
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_108);
  if (local_108._M_p != local_100 + 8) {
    operator_delete(local_108._M_p,local_100._8_8_ + 1);
  }
  bVar7 = Result::good((Result *)&local_138);
  if (bVar7) {
    validateOutputCount((Result *)local_110,layer,1,1);
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_108);
    if (local_108._M_p != local_100 + 8) {
      operator_delete(local_108._M_p,local_100._8_8_ + 1);
    }
  }
  bVar7 = Result::good((Result *)&local_138);
  if (!bVar7) goto LAB_005375bd;
  if (this->ndArrayInterpretation != true) goto LAB_00537594;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CropResize","");
  local_d8 = &this->blobNameToRank;
  validateInputOutputRankEquality((Result *)local_110,layer,&local_50,local_d8);
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110;
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_108);
  if (local_108._M_p != local_100 + 8) {
    operator_delete(local_108._M_p,local_100._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar7 = Result::good((Result *)&local_138);
  if (bVar7) {
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CropResize","");
    validateRankCount((Result *)local_110,layer,&local_d0,5,-1,local_d8);
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_108);
    if (local_108._M_p != local_100 + 8) {
      operator_delete(local_108._M_p,local_100._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    bVar7 = Result::good((Result *)&local_138);
    if (bVar7) {
      if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_110,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar8 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_110,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar8);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_110);
      }
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_d8->_M_t,
                     (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
      p_Var20 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar9._M_node == p_Var20) {
LAB_00537594:
        if (layer->_oneof_case_[0] == 0xd4) {
          LVar12 = layer->layer_;
        }
        else {
          LVar12.cropresize_ = Specification::CropResizeLayerParams::default_instance();
        }
        if ((((LVar12.convolution_)->kernelsize_).current_size_ & 0xfffffffdU) == 0)
        goto LAB_005375bd;
        std::operator+(&local_70,"Target Size in the crop resize layer \'",(layer->name_).ptr_);
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
        paVar1 = &local_b0.field_2;
        puVar16 = (ulong *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_b0.field_2._M_allocated_capacity = *puVar16;
          local_b0.field_2._8_8_ = plVar13[3];
          local_b0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *puVar16;
          local_b0._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_b0._M_string_length = plVar13[1];
        *plVar13 = (long)puVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        uVar3 = ((LVar12.convolution_)->kernelsize_).current_size_;
        __val = -uVar3;
        if (0 < (int)uVar3) {
          __val = uVar3;
        }
        __len = 1;
        if (9 < __val) {
          uVar17 = (ulong)__val;
          uVar6 = 4;
          do {
            __len = uVar6;
            uVar15 = (uint)uVar17;
            if (uVar15 < 100) {
              __len = __len - 2;
              goto LAB_00537720;
            }
            if (uVar15 < 1000) {
              __len = __len - 1;
              goto LAB_00537720;
            }
            if (uVar15 < 10000) goto LAB_00537720;
            uVar17 = uVar17 / 10000;
            uVar6 = __len + 4;
          } while (99999 < uVar15);
          __len = __len + 1;
        }
LAB_00537720:
        local_90 = local_80;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_90,(char)__len - (char)((int)uVar3 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_90),__len,__val);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          uVar18 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_88 + local_b0._M_string_length) {
          uVar17 = 0xf;
          if (local_90 != local_80) {
            uVar17 = local_80[0];
          }
          if (uVar17 < local_88 + local_b0._M_string_length) goto LAB_005377b8;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
        }
        else {
LAB_005377b8:
          puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90)
          ;
        }
        local_110 = (undefined1  [8])local_100;
        puVar16 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_100._0_8_ = *puVar16;
          local_100._8_8_ = puVar14[3];
        }
        else {
          local_100._0_8_ = *puVar16;
          local_110 = (undefined1  [8])*puVar14;
        }
        local_108._M_p = (pointer)puVar14[1];
        *puVar14 = puVar16;
        puVar14[1] = 0;
        *(undefined1 *)puVar16 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_110);
        puVar16 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_d0.field_2._M_allocated_capacity = *puVar16;
          local_d0.field_2._8_8_ = puVar14[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *puVar16;
          local_d0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_d0._M_string_length = puVar14[1];
        *puVar14 = puVar16;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        if (local_110 != (undefined1  [8])local_100) {
          operator_delete((void *)local_110,local_100._0_8_ + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result((Result *)local_110,INVALID_MODEL_PARAMETERS,&local_d0);
        local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110;
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_108);
        if (local_108._M_p != local_100 + 8) {
          operator_delete(local_108._M_p,local_100._8_8_ + 1);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)__return_storage_ptr__ = local_138;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p == &local_120) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_120._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_130._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_128;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        uVar18 = local_d0.field_2._M_allocated_capacity;
        _Var19._M_p = local_d0._M_dataplus._M_p;
        local_130._M_p = (pointer)&local_120;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0053760b;
      }
      else {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_110,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar8 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_110,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar8);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_110);
        }
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_d8->_M_t,
                       *(key_type **)((layer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
        if ((_Rb_tree_header *)iVar9._M_node == p_Var20) goto LAB_00537594;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&(layer->input_).super_RepeatedPtrFieldBase,0);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(local_d8,pTVar10);
        iVar2 = *pmVar11;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&(layer->input_).super_RepeatedPtrFieldBase,1);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::at(local_d8,pTVar10);
        if (iVar2 == *pmVar11) goto LAB_00537594;
        local_108._M_p = (pointer)0x0;
        local_100._0_8_ = local_100._0_8_ & 0xffffffffffffff00;
        psVar4 = (layer->name_).ptr_;
        pcVar5 = (psVar4->_M_dataplus)._M_p;
        local_110 = (undefined1  [8])local_100;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar5,pcVar5 + psVar4->_M_string_length);
        std::operator+(&local_b0,"Layer \'",&local_70);
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
        puVar16 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_d0.field_2._M_allocated_capacity = *puVar16;
          local_d0.field_2._8_8_ = puVar14[3];
          local_d0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *puVar16;
          local_d0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_d0._M_string_length = puVar14[1];
        *puVar14 = puVar16;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_110,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_110);
        uVar18 = local_100._0_8_;
        _Var19._M_p = (pointer)local_110;
        if (local_110 == (undefined1  [8])local_100) goto LAB_0053760b;
      }
      operator_delete(_Var19._M_p,uVar18 + 1);
      goto LAB_0053760b;
    }
  }
LAB_005375bd:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_138;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p == &local_120) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_120._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_130._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_128;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  local_130._M_p = (pointer)&local_120;
LAB_0053760b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,
                    CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropResizeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "CropResize", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "CropResize", 5, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
            blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
            if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                std::string err;
                err = "Layer '" + std::string(layer.name()) + "' of type 'CropResize' expects equal ranks for its inputs, but they are not equal.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }

    }

    const auto& params = layer.cropresize();
    // target Size must be 2D if provided
    if (!(params.targetsize_size() == 0 || params.targetsize_size() == 2)) {
        std::string err = "Target Size in the crop resize layer '" + layer.name() + "' must be a vector of size 2 (i.e height, width) but is a vector of size " + std::to_string(params.targetsize_size()) + ".";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}